

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_contracthashutil.cpp
# Opt level: O0

void __thiscall
ContractHashUtil_GetContractScriptFailFedpegScript_Test::TestBody
          (ContractHashUtil_GetContractScriptFailFedpegScript_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *rhs;
  AssertHelper local_1a0;
  Message local_198;
  string local_190;
  undefined1 local_170 [8];
  AssertionResult gtest_ar;
  Message local_158 [2];
  Script local_148;
  Script local_110;
  reference local_d8;
  CfdCoreTest_FedpegScriptData *script_data;
  const_iterator __end1;
  const_iterator __begin1;
  vector<CfdCoreTest_FedpegScriptData,_std::allocator<CfdCoreTest_FedpegScriptData>_> *__range1;
  Script script;
  allocator local_69;
  string local_68;
  undefined1 local_48 [8];
  Script claim_script;
  ContractHashUtil_GetContractScriptFailFedpegScript_Test *this_local;
  
  claim_script.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_68,"0014fd1cd5452a43ca210ba7153d64227dc32acf6dbb",&local_69);
  cfd::core::Script::Script((Script *)local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  cfd::core::Script::Script((Script *)&__range1);
  __end1 = std::vector<CfdCoreTest_FedpegScriptData,_std::allocator<CfdCoreTest_FedpegScriptData>_>
           ::begin(&fedpeg_fail_test_vectors);
  script_data = (CfdCoreTest_FedpegScriptData *)
                std::
                vector<CfdCoreTest_FedpegScriptData,_std::allocator<CfdCoreTest_FedpegScriptData>_>
                ::end(&fedpeg_fail_test_vectors);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_CfdCoreTest_FedpegScriptData_*,_std::vector<CfdCoreTest_FedpegScriptData,_std::allocator<CfdCoreTest_FedpegScriptData>_>_>
                                     *)&script_data), bVar1) {
    local_d8 = __gnu_cxx::
               __normal_iterator<const_CfdCoreTest_FedpegScriptData_*,_std::vector<CfdCoreTest_FedpegScriptData,_std::allocator<CfdCoreTest_FedpegScriptData>_>_>
               ::operator*(&__end1);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        cfd::core::Script::Script(&local_148,&local_d8->fedpeg_script);
        cfd::core::ContractHashUtil::GetContractScript(&local_110,(Script *)local_48,&local_148);
        cfd::core::Script::operator=((Script *)&__range1,&local_110);
        cfd::core::Script::~Script(&local_110);
        cfd::core::Script::~Script(&local_148);
      }
    }
    else {
      testing::Message::Message(local_158);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_contracthashutil.cpp"
                 ,100,
                 "Expected: (script = ContractHashUtil::GetContractScript(claim_script, Script(script_data.fedpeg_script))) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_158);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
      testing::Message::~Message(local_158);
    }
    cfd::core::Script::GetHex_abi_cxx11_(&local_190,(Script *)&__range1);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    rhs = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_170,"script.GetHex().c_str()","script_data.contract_script.c_str()"
               ,pcVar2,rhs);
    std::__cxx11::string::~string((string *)&local_190);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
    if (!bVar1) {
      testing::Message::Message(&local_198);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_contracthashutil.cpp"
                 ,0x65,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
      testing::internal::AssertHelper::~AssertHelper(&local_1a0);
      testing::Message::~Message(&local_198);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
    __gnu_cxx::
    __normal_iterator<const_CfdCoreTest_FedpegScriptData_*,_std::vector<CfdCoreTest_FedpegScriptData,_std::allocator<CfdCoreTest_FedpegScriptData>_>_>
    ::operator++(&__end1);
  }
  cfd::core::Script::~Script((Script *)&__range1);
  cfd::core::Script::~Script((Script *)local_48);
  return;
}

Assistant:

TEST(ContractHashUtil, GetContractScriptFailFedpegScript) {
  Script claim_script("0014fd1cd5452a43ca210ba7153d64227dc32acf6dbb");
  Script script;
  for (const auto& script_data : fedpeg_fail_test_vectors) {
    EXPECT_NO_THROW(
        (script = ContractHashUtil::GetContractScript(claim_script,
            Script(script_data.fedpeg_script))));
    EXPECT_STREQ(script.GetHex().c_str(), script_data.contract_script.c_str());
  }
}